

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::LocalWALAppend
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,DataChunk *chunk,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  int iVar1;
  undefined4 extraout_var;
  LocalAppendState append_state;
  
  LocalAppendState::LocalAppendState(&append_state);
  iVar1 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  InitializeLocalAppend
            ((DataTable *)CONCAT44(extraout_var,iVar1),&append_state,table,context,bound_constraints
            );
  LocalAppend((DataTable *)CONCAT44(extraout_var,iVar1),&append_state,context,chunk,true);
  (append_state.storage)->index_append_mode = INSERT_DUPLICATES;
  LocalStorage::FinalizeAppend(&append_state);
  LocalAppendState::~LocalAppendState(&append_state);
  return;
}

Assistant:

void DataTable::LocalWALAppend(TableCatalogEntry &table, ClientContext &context, DataChunk &chunk,
                               const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
	LocalAppendState append_state;
	auto &storage = table.GetStorage();
	storage.InitializeLocalAppend(append_state, table, context, bound_constraints);

	storage.LocalAppend(append_state, context, chunk, true);
	append_state.storage->index_append_mode = IndexAppendMode::INSERT_DUPLICATES;
	storage.FinalizeLocalAppend(append_state);
}